

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O2

void uss_return_handle_raw(UnixSftpServer *uss,SftpReplyBuilder *reply,int index,uint seq)

{
  ushort uVar1;
  ptrlen pVar2;
  uchar handlebuf [8];
  
  uVar1 = (ushort)index << 8 | (ushort)index >> 8;
  handlebuf[2] = (char)uVar1;
  handlebuf[3] = (char)(uVar1 >> 8);
  handlebuf[1] = (char)((uint)index >> 0x10);
  handlebuf[0] = (char)((uint)index >> 0x18);
  handlebuf[7] = (char)seq;
  handlebuf[6] = (char)(seq >> 8);
  handlebuf[5] = (char)(seq >> 0x10);
  handlebuf[4] = (uchar)(seq >> 0x18);
  des_encrypt_xdmauth(uss->handlekey,handlebuf,8);
  pVar2.len = 8;
  pVar2.ptr = handlebuf;
  (*reply->vt->reply_handle)(reply,pVar2);
  return;
}

Assistant:

static void uss_return_handle_raw(
    UnixSftpServer *uss, SftpReplyBuilder *reply, int index, unsigned seq)
{
    unsigned char handlebuf[8];
    PUT_32BIT_MSB_FIRST(handlebuf, index);
    PUT_32BIT_MSB_FIRST(handlebuf + 4, seq);
    des_encrypt_xdmauth(uss->handlekey, handlebuf, 8);
    fxp_reply_handle(reply, make_ptrlen(handlebuf, 8));
}